

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O0

int Connectublox(UBLOX *publox,char *szCfgFilePath)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char local_128 [8];
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  UBLOX *publox_local;
  
  line[0xf8] = '\0';
  line[0xf9] = '\0';
  line[0xfa] = '\0';
  line[0xfb] = '\0';
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  memset(publox->szCfgFilePath,0,0x100);
  sprintf(publox->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(local_128,0,0x100);
    memset(publox->szDevPath,0,0x100);
    sprintf(publox->szDevPath,"COM1");
    publox->BaudRate = 0x2580;
    publox->timeout = 1000;
    publox->threadperiod = 100;
    publox->bSaveRawData = 1;
    publox->bRevertToDefaultCfg = 1;
    publox->SetCfg = 0;
    publox->SurveyMode = 0;
    publox->svinMinDur = 30.0;
    publox->svinAccLimit = 10.0;
    publox->fixedLat = 0.0;
    publox->fixedLon = 0.0;
    publox->fixedAlt = 0.0;
    publox->fixedPosAcc = 10.0;
    publox->bSaveCfg = 0;
    publox->bDisableRTCMTransfer = 0;
    publox->bSendStartSentence = 0;
    memset(publox->szStartSentence,0,0x100);
    sprintf(publox->szStartSentence,"$GPS_START");
    publox->bSendStopSentence = 0;
    memset(publox->szStopSentence,0,0x100);
    sprintf(publox->szStopSentence,"$GPS_STOP");
    publox->bEnable_NMEA_GGA = 0;
    publox->bEnable_NMEA_RMC = 0;
    publox->bEnable_NMEA_GLL = 0;
    publox->bEnable_NMEA_VTG = 0;
    publox->bEnable_NMEA_HDG = 0;
    publox->bEnable_NMEA_HDT = 0;
    publox->bEnable_NMEA_ROT = 0;
    publox->bEnable_NMEA_MWV = 0;
    publox->bEnable_NMEA_MWD = 0;
    publox->bEnable_NMEA_MDA = 0;
    publox->bEnable_NMEA_DID = 0;
    publox->bEnable_NMEA_VDM = 0;
    publox->bEnable_NMEA_PD6_SA = 0;
    publox->bEnable_NMEA_PD6_TS = 0;
    publox->bEnable_NMEA_PD6_BI = 0;
    publox->bEnable_NMEA_PD6_BS = 0;
    publox->bEnable_NMEA_PD6_BE = 0;
    publox->bEnable_NMEA_PD6_BD = 0;
    publox->bEnable_UBX_NAV_HPPOSLLH = 0;
    publox->bEnable_UBX_NAV_POSLLH = 1;
    publox->bEnable_UBX_NAV_PVT = 1;
    publox->bEnable_UBX_NAV_RELPOSNED = 0;
    publox->bEnable_UBX_NAV_SOL = 0;
    publox->bEnable_UBX_NAV_STATUS = 1;
    publox->bEnable_UBX_NAV_SVIN = 0;
    publox->bEnable_UBX_NAV_VELNED = 0;
    line._248_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._248_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%255s",publox->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bRevertToDefaultCfg);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->SetCfg);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->SurveyMode);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&publox->svinMinDur);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&publox->svinAccLimit);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&publox->fixedLat);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&publox->fixedLon);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&publox->fixedAlt);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%lf",&publox->fixedPosAcc);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bSaveCfg);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bDisableRTCMTransfer);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bSendStartSentence);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets4((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%255s",publox->szStartSentence);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bSendStopSentence);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets4((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%255s",publox->szStopSentence);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_GGA);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_RMC);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_GLL);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_VTG);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_HDG);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_HDT);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_ROT);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_MWV);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_MWD);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_MDA);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_DID);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_VDM);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_PD6_SA);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_PD6_TS);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_PD6_BI);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_PD6_BS);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_PD6_BE);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_NMEA_PD6_BD);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_UBX_NAV_HPPOSLLH);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_UBX_NAV_POSLLH);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_UBX_NAV_PVT);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_UBX_NAV_RELPOSNED);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_UBX_NAV_SOL);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_UBX_NAV_STATUS);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_UBX_NAV_SVIN);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&publox->bEnable_UBX_NAV_VELNED);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose((FILE *)line._248_8_);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (publox->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    publox->threadperiod = 100;
  }
  if ((publox->fixedLat <= -90.0 && publox->fixedLat != -90.0) || (90.0 < publox->fixedLat)) {
    printf("Invalid parameter : fixedLat.\n");
    publox->fixedLat = 0.0;
  }
  if ((publox->fixedLon <= -180.0 && publox->fixedLon != -180.0) || (180.0 < publox->fixedLon)) {
    printf("Invalid parameter : fixedLon.\n");
    publox->fixedLon = 0.0;
  }
  sVar3 = strlen(publox->szStartSentence);
  if (0xfe < sVar3) {
    printf("Invalid parameter : szStartSentence.\n");
    memset(publox->szStartSentence,0,0x100);
    sprintf(publox->szStartSentence,"$GPS_START");
  }
  sVar3 = strlen(publox->szStopSentence);
  if (0xfe < sVar3) {
    printf("Invalid parameter : szStopSentence.\n");
    memset(publox->szStopSentence,0,0x100);
    sprintf(publox->szStopSentence,"$GPS_STOP");
  }
  memset(&publox->LastUBXData,0,0x1b8);
  iVar1 = OpenRS232Port(&publox->RS232Port,publox->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&publox->RS232Port,publox->BaudRate,'\0',0,'\b','\0',publox->timeout
                               );
    if (iVar1 == 0) {
      if (publox->bRevertToDefaultCfg != 0) {
        iVar1 = RevertToDefaultCfgublox(publox);
        if (iVar1 != 0) {
          printf("Unable to configure a ublox.\n");
          CloseRS232Port(&publox->RS232Port);
          return 1;
        }
        mSleep(0xfa);
      }
      iVar1 = publox->SetCfg;
      if (iVar1 != 0) {
        if (iVar1 == 1) {
          iVar1 = SetRoverCfgublox(publox);
          if (iVar1 != 0) {
            printf("Unable to configure a ublox.\n");
            CloseRS232Port(&publox->RS232Port);
            return 1;
          }
          mSleep(0xfa);
        }
        else if (iVar1 == 2) {
          iVar1 = SetBaseCfgublox(publox);
          if (iVar1 != 0) {
            printf("Unable to configure a ublox.\n");
            CloseRS232Port(&publox->RS232Port);
            return 1;
          }
          mSleep(0xfa);
        }
      }
      if (publox->bSaveCfg != 0) {
        iVar1 = SaveCfgublox(publox);
        if (iVar1 != 0) {
          printf("Unable to configure a ublox.\n");
          CloseRS232Port(&publox->RS232Port);
          return 1;
        }
        mSleep(0xfa);
      }
      if (publox->bSendStartSentence != 0) {
        sVar3 = strlen(publox->szStartSentence);
        iVar1 = TransferToublox(publox,(uchar *)publox->szStartSentence,(int)sVar3);
        if (iVar1 != 0) {
          printf("Unable to configure a ublox.\n");
          CloseRS232Port(&publox->RS232Port);
          return 1;
        }
        mSleep(0xfa);
      }
      printf("ublox connected.\n");
      publox_local._4_4_ = 0;
    }
    else {
      printf("Unable to connect to a ublox.\n");
      CloseRS232Port(&publox->RS232Port);
      publox_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a ublox.\n");
    publox_local._4_4_ = 1;
  }
  return publox_local._4_4_;
}

Assistant:

inline int Connectublox(UBLOX* publox, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(publox->szCfgFilePath, 0, sizeof(publox->szCfgFilePath));
	sprintf(publox->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(publox->szDevPath, 0, sizeof(publox->szDevPath));
		sprintf(publox->szDevPath, "COM1");
		publox->BaudRate = 9600;
		publox->timeout = 1000;
		publox->threadperiod = 100;
		publox->bSaveRawData = 1;
		publox->bRevertToDefaultCfg = 1;
		publox->SetCfg = KEEP_CURRENT_CFG_UBX;
		publox->SurveyMode = DISABLED_SURVEY_RECEIVER_MODE_UBX;
		publox->svinMinDur = 30;
		publox->svinAccLimit = 10;
		publox->fixedLat = 0;
		publox->fixedLon = 0;
		publox->fixedAlt = 0;
		publox->fixedPosAcc = 10;
		publox->bSaveCfg = 0;
		publox->bDisableRTCMTransfer = 0;
		publox->bSendStartSentence = 0;
		memset(publox->szStartSentence, 0, sizeof(publox->szStartSentence));
		sprintf(publox->szStartSentence, "$GPS_START");
		publox->bSendStopSentence = 0;
		memset(publox->szStopSentence, 0, sizeof(publox->szStopSentence));
		sprintf(publox->szStopSentence, "$GPS_STOP");
		publox->bEnable_NMEA_GGA = 0;
		publox->bEnable_NMEA_RMC = 0;
		publox->bEnable_NMEA_GLL = 0;
		publox->bEnable_NMEA_VTG = 0;
		publox->bEnable_NMEA_HDG = 0;
		publox->bEnable_NMEA_HDT = 0;
		publox->bEnable_NMEA_ROT = 0;
		publox->bEnable_NMEA_MWV = 0;
		publox->bEnable_NMEA_MWD = 0;
		publox->bEnable_NMEA_MDA = 0;
		publox->bEnable_NMEA_DID = 0;
		publox->bEnable_NMEA_VDM = 0;
		publox->bEnable_NMEA_PD6_SA = 0;
		publox->bEnable_NMEA_PD6_TS = 0;
		publox->bEnable_NMEA_PD6_BI = 0;
		publox->bEnable_NMEA_PD6_BS = 0;
		publox->bEnable_NMEA_PD6_BE = 0;
		publox->bEnable_NMEA_PD6_BD = 0;
		publox->bEnable_UBX_NAV_HPPOSLLH = 0;
		publox->bEnable_UBX_NAV_POSLLH = 1;
		publox->bEnable_UBX_NAV_PVT = 1;
		publox->bEnable_UBX_NAV_RELPOSNED = 0;
		publox->bEnable_UBX_NAV_SOL = 0;
		publox->bEnable_UBX_NAV_STATUS = 1;
		publox->bEnable_UBX_NAV_SVIN = 0;
		publox->bEnable_UBX_NAV_VELNED = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", publox->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bRevertToDefaultCfg) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->SetCfg) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->SurveyMode) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->svinMinDur) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->svinAccLimit) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->fixedLat) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->fixedLon) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->fixedAlt) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%lf", &publox->fixedPosAcc) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bSaveCfg) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bDisableRTCMTransfer) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bSendStartSentence) != 1) printf("Invalid configuration file.\n");
			// Need fgets4() because of '$'...
			if (fgets4(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", publox->szStartSentence) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bSendStopSentence) != 1) printf("Invalid configuration file.\n");
			// Need fgets4() because of '$'...
			if (fgets4(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", publox->szStopSentence) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_GGA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_RMC) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_GLL) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_VTG) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_HDG) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_HDT) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_ROT) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_MWV) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_MWD) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_MDA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_DID) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_VDM) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_SA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_TS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_BI) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_BS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_BE) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_NMEA_PD6_BD) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_HPPOSLLH) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_POSLLH) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_PVT) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_RELPOSNED) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_SOL) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_STATUS) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_SVIN) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &publox->bEnable_UBX_NAV_VELNED) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (publox->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		publox->threadperiod = 100;
	}
	if ((publox->fixedLat < -90)||(publox->fixedLat > 90))
	{
		printf("Invalid parameter : fixedLat.\n");
		publox->fixedLat = 0;
	}
	if ((publox->fixedLon < -180)||(publox->fixedLon > 180))
	{
		printf("Invalid parameter : fixedLon.\n");
		publox->fixedLon = 0;
	}
	if (strlen(publox->szStartSentence) >= 255)
	{
		printf("Invalid parameter : szStartSentence.\n");
		memset(publox->szStartSentence, 0, sizeof(publox->szStartSentence));
		sprintf(publox->szStartSentence, "$GPS_START");
	}
	if (strlen(publox->szStopSentence) >= 255)
	{
		printf("Invalid parameter : szStopSentence.\n");
		memset(publox->szStopSentence, 0, sizeof(publox->szStopSentence));
		sprintf(publox->szStopSentence, "$GPS_STOP");
	}

	// Used to save raw data, should be handled specifically...
	//publox->pfSaveFile = NULL;

	memset(&publox->LastUBXData, 0, sizeof(UBXDATA));

	if (OpenRS232Port(&publox->RS232Port, publox->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a ublox.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&publox->RS232Port, publox->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)publox->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a ublox.\n");
		CloseRS232Port(&publox->RS232Port);
		return EXIT_FAILURE;
	}

	if (publox->bRevertToDefaultCfg)
	{
		if (RevertToDefaultCfgublox(publox) != EXIT_SUCCESS)
		{
			printf("Unable to configure a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(250);
	}

	switch (publox->SetCfg)
	{
	case SET_BASE_CFG_UBX:
		if (SetBaseCfgublox(publox) != EXIT_SUCCESS)
		{
			printf("Unable to configure a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(250);
		break;
	case SET_ROVER_CFG_UBX:
		if (SetRoverCfgublox(publox) != EXIT_SUCCESS)
		{
			printf("Unable to configure a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(250);
		break;
	case KEEP_CURRENT_CFG_UBX:
	default:
		break;
	}

	if (publox->bSaveCfg)
	{
		if (SaveCfgublox(publox) != EXIT_SUCCESS)
		{
			printf("Unable to configure a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(250);
	}

	if (publox->bSendStartSentence)
	{
		if (TransferToublox(publox, (unsigned char*)publox->szStartSentence, (int)strlen(publox->szStartSentence)) != EXIT_SUCCESS)
		{
			printf("Unable to configure a ublox.\n");
			CloseRS232Port(&publox->RS232Port);
			return EXIT_FAILURE;
		}
		mSleep(250);
	}

	printf("ublox connected.\n");

	return EXIT_SUCCESS;
}